

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O1

bool __thiscall gnilk::IPCFifoUnix::Open(IPCFifoUnix *this)

{
  string *__source;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  path local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->isOpen != false) {
    return true;
  }
  uVar7 = getpid();
  __source = &this->fifoname;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_98,__source,auto_format);
  cVar5 = std::filesystem::status(&local_98);
  std::filesystem::__cxx11::path::~path(&local_98);
  if ((cVar5 != '\0') && (cVar5 != -1)) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_98,__source,auto_format);
    std::filesystem::remove(&local_98);
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,fifoBaseName_abi_cxx11_._M_dataplus._M_p,
             fifoBaseName_abi_cxx11_._M_dataplus._M_p + fifoBaseName_abi_cxx11_._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b8,"_");
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar10 = (uint)uVar11;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_0012e387;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_0012e387;
      }
      if (uVar10 < 10000) goto LAB_0012e387;
      uVar11 = uVar11 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_0012e387:
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(__len + -((int)uVar7 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar7 >> 0x1f),__len,__val);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar12 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_70._M_string_length + local_b8._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      uVar12 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_b8._M_string_length <= (ulong)uVar12) {
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_70,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      goto LAB_0012e417;
    }
  }
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b8,local_70._M_dataplus._M_p,local_70._M_string_length);
LAB_0012e417:
  local_98._M_pathname._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar1 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p == paVar1) {
    local_98._M_pathname.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98._M_pathname.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
  }
  else {
    local_98._M_pathname.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98._M_pathname._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar9->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__source,&local_98._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_pathname._M_dataplus._M_p != &local_98._M_pathname.field_2) {
    operator_delete(local_98._M_pathname._M_dataplus._M_p,
                    local_98._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar8 = mkfifo((this->fifoname)._M_dataplus._M_p,0x1b6);
  this->fifofd = iVar8;
  if (iVar8 < 0) {
    perror("IPCFifoUnix::Open, mkfifo");
    bVar6 = false;
  }
  else {
    this->isOwner = true;
    pcVar3 = (this->fifoname)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (this->fifoname)._M_string_length);
    bVar6 = ConnectTo(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar6;
}

Assistant:

bool IPCFifoUnix::Open() {
    if (isOpen) {
        return true;
    }

    // Create name with pid - we need to be able to run multiple app's in parallel...
    auto pid = getpid();

    // if it exists - remove it - as it ought to be a left over from an old process or someone restarted the logger
    if (std::filesystem::exists(fifoname)) {
        std::filesystem::remove(fifoname);
    }

    fifoname = fifoBaseName + "_" + std::to_string(pid);

    // Create the fifo
    fifofd = mkfifo(fifoname.c_str(), 0666);
    if (fifofd < 0) {
        perror("IPCFifoUnix::Open, mkfifo");
        return false;
    }
    isOwner = true;
    return ConnectTo(fifoname);
}